

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_2_5::anon_unknown_9::dctInverse8x8_sse2<7>(float *data)

{
  undefined8 uVar1;
  float *pfVar2;
  float *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  __m128 beta [4];
  __m128 alpha [4];
  __m128 in [8];
  __m128 oddSum;
  __m128 evenSum;
  __m128 x [8];
  __m128 *srcVec;
  __m128 c7;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  __m128 g;
  __m128 f;
  __m128 e;
  __m128 d;
  __m128 c;
  __m128 b;
  __m128 a;
  int local_be0;
  int local_bdc;
  undefined8 local_ad8 [98];
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  int i;
  int col;
  __m128 gamma [4];
  
  fVar3 = *in_RDI;
  fVar28 = in_RDI[1];
  fVar7 = in_RDI[2];
  fVar4 = in_RDI[3];
  fVar17 = in_RDI[4];
  fVar5 = in_RDI[5];
  fVar42 = in_RDI[6];
  fVar6 = in_RDI[7];
  fVar39 = fVar3 * 0.3535536 + 0.0 + fVar7 * 0.4619398 + fVar17 * 0.3535536 + fVar42 * 0.1913422;
  fVar40 = fVar3 * 0.3535536 + 0.0 + fVar7 * 0.1913422 + fVar17 * -0.3535536 + fVar42 * -0.4619398;
  fVar41 = fVar3 * 0.3535536 + 0.0 + fVar7 * -0.1913422 + fVar17 * -0.3535536 + fVar42 * 0.4619398;
  fVar42 = fVar3 * 0.3535536 + 0.0 + fVar7 * -0.4619398 + fVar17 * 0.3535536 + fVar42 * -0.1913422;
  fVar3 = fVar28 * 0.4903927 + 0.0 + fVar4 * 0.4157349 + fVar5 * 0.2777855 + fVar6 * 0.09754573;
  fVar7 = fVar28 * 0.4157349 + 0.0 + fVar4 * -0.09754573 + fVar5 * -0.4903927 + fVar6 * -0.2777855;
  fVar17 = fVar28 * 0.2777855 + 0.0 + fVar4 * -0.4903927 + fVar5 * 0.09754573 + fVar6 * 0.4157349;
  fVar28 = fVar28 * 0.09754573 + 0.0 + fVar4 * -0.2777855 + fVar5 * 0.4157349 + fVar6 * -0.4903927;
  *in_RDI = fVar39 + fVar3;
  in_RDI[1] = fVar40 + fVar7;
  in_RDI[2] = fVar41 + fVar17;
  in_RDI[3] = fVar42 + fVar28;
  in_RDI[4] = fVar39 - fVar3;
  in_RDI[5] = fVar40 - fVar7;
  in_RDI[6] = fVar41 - fVar17;
  in_RDI[7] = fVar42 - fVar28;
  fVar3 = in_RDI[4];
  fVar28 = in_RDI[5];
  in_RDI[4] = in_RDI[7];
  in_RDI[5] = in_RDI[6];
  in_RDI[6] = fVar28;
  in_RDI[7] = fVar3;
  for (local_bdc = 0; local_bdc < 2; local_bdc = local_bdc + 1) {
    for (local_be0 = 0; local_be0 < 8; local_be0 = local_be0 + 1) {
      uVar1 = *(undefined8 *)(in_RDI + (long)(local_be0 * 2 + local_bdc) * 4 + 2);
      local_ad8[(long)local_be0 * 2] =
           *(undefined8 *)(in_RDI + (long)(local_be0 * 2 + local_bdc) * 4);
      local_ad8[(long)local_be0 * 2 + 1] = uVar1;
    }
    local_308 = (float)local_ad8[4];
    fStack_304 = (float)((ulong)local_ad8[4] >> 0x20);
    fStack_300 = (float)local_ad8[5];
    fStack_2fc = (float)((ulong)local_ad8[5] >> 0x20);
    local_348 = (float)local_ad8[0xc];
    fStack_344 = (float)((ulong)local_ad8[0xc] >> 0x20);
    fStack_340 = (float)local_ad8[0xd];
    fStack_33c = (float)((ulong)local_ad8[0xd] >> 0x20);
    local_378 = (float)local_ad8[2];
    fStack_374 = (float)((ulong)local_ad8[2] >> 0x20);
    fStack_370 = (float)local_ad8[3];
    fStack_36c = (float)((ulong)local_ad8[3] >> 0x20);
    local_398 = (float)local_ad8[6];
    fStack_394 = (float)((ulong)local_ad8[6] >> 0x20);
    fStack_390 = (float)local_ad8[7];
    fStack_38c = (float)((ulong)local_ad8[7] >> 0x20);
    local_3b8 = (float)local_ad8[10];
    fStack_3b4 = (float)((ulong)local_ad8[10] >> 0x20);
    fStack_3b0 = (float)local_ad8[0xb];
    fStack_3ac = (float)((ulong)local_ad8[0xb] >> 0x20);
    local_3d8 = (float)local_ad8[0xe];
    fStack_3d4 = (float)((ulong)local_ad8[0xe] >> 0x20);
    fStack_3d0 = (float)local_ad8[0xf];
    fStack_3cc = (float)((ulong)local_ad8[0xf] >> 0x20);
    fVar3 = local_378 * 0.4903927 + local_398 * 0.4157349 +
            local_3b8 * 0.2777855 + local_3d8 * 0.09754573;
    fVar41 = fStack_374 * 0.4903927 + fStack_394 * 0.4157349 +
             fStack_3b4 * 0.2777855 + fStack_3d4 * 0.09754573;
    fVar18 = fStack_370 * 0.4903927 + fStack_390 * 0.4157349 +
             fStack_3b0 * 0.2777855 + fStack_3d0 * 0.09754573;
    fVar29 = fStack_36c * 0.4903927 + fStack_38c * 0.4157349 +
             fStack_3ac * 0.2777855 + fStack_3cc * 0.09754573;
    fVar28 = (local_378 * 0.4157349 - local_398 * 0.09754573) -
             (local_3b8 * 0.4903927 + local_3d8 * 0.2777855);
    fVar8 = (fStack_374 * 0.4157349 - fStack_394 * 0.09754573) -
            (fStack_3b4 * 0.4903927 + fStack_3d4 * 0.2777855);
    fVar19 = (fStack_370 * 0.4157349 - fStack_390 * 0.09754573) -
             (fStack_3b0 * 0.4903927 + fStack_3d0 * 0.2777855);
    fVar30 = (fStack_36c * 0.4157349 - fStack_38c * 0.09754573) -
             (fStack_3ac * 0.4903927 + fStack_3cc * 0.2777855);
    fVar7 = (local_378 * 0.2777855 - local_398 * 0.4903927) +
            local_3b8 * 0.09754573 + local_3d8 * 0.4157349;
    fVar9 = (fStack_374 * 0.2777855 - fStack_394 * 0.4903927) +
            fStack_3b4 * 0.09754573 + fStack_3d4 * 0.4157349;
    fVar20 = (fStack_370 * 0.2777855 - fStack_390 * 0.4903927) +
             fStack_3b0 * 0.09754573 + fStack_3d0 * 0.4157349;
    fVar31 = (fStack_36c * 0.2777855 - fStack_38c * 0.4903927) +
             fStack_3ac * 0.09754573 + fStack_3cc * 0.4157349;
    fVar4 = (local_378 * 0.09754573 - local_398 * 0.2777855) +
            (local_3b8 * 0.4157349 - local_3d8 * 0.4903927);
    fVar10 = (fStack_374 * 0.09754573 - fStack_394 * 0.2777855) +
             (fStack_3b4 * 0.4157349 - fStack_3d4 * 0.4903927);
    fVar21 = (fStack_370 * 0.09754573 - fStack_390 * 0.2777855) +
             (fStack_3b0 * 0.4157349 - fStack_3d0 * 0.4903927);
    fVar32 = (fStack_36c * 0.09754573 - fStack_38c * 0.2777855) +
             (fStack_3ac * 0.4157349 - fStack_3cc * 0.4903927);
    local_7b8 = (float)local_ad8[0];
    fStack_7b4 = (float)((ulong)local_ad8[0] >> 0x20);
    fStack_7b0 = (float)local_ad8[1];
    fStack_7ac = (float)((ulong)local_ad8[1] >> 0x20);
    local_7c8 = (float)local_ad8[8];
    fStack_7c4 = (float)((ulong)local_ad8[8] >> 0x20);
    fStack_7c0 = (float)local_ad8[9];
    fStack_7bc = (float)((ulong)local_ad8[9] >> 0x20);
    fVar40 = (local_7b8 + local_7c8) * 0.3535536;
    fVar11 = (fStack_7b4 + fStack_7c4) * 0.3535536;
    fVar22 = (fStack_7b0 + fStack_7c0) * 0.3535536;
    fVar33 = (fStack_7ac + fStack_7bc) * 0.3535536;
    fVar39 = (local_7b8 - local_7c8) * 0.3535536;
    fVar12 = (fStack_7b4 - fStack_7c4) * 0.3535536;
    fVar23 = (fStack_7b0 - fStack_7c0) * 0.3535536;
    fVar34 = (fStack_7ac - fStack_7bc) * 0.3535536;
    fVar17 = local_308 * 0.4619398 + local_348 * 0.1913422;
    fVar13 = fStack_304 * 0.4619398 + fStack_344 * 0.1913422;
    fVar24 = fStack_300 * 0.4619398 + fStack_340 * 0.1913422;
    fVar35 = fStack_2fc * 0.4619398 + fStack_33c * 0.1913422;
    fVar5 = local_308 * 0.1913422 - local_348 * 0.4619398;
    fVar14 = fStack_304 * 0.1913422 - fStack_344 * 0.4619398;
    fVar25 = fStack_300 * 0.1913422 - fStack_340 * 0.4619398;
    fVar36 = fStack_2fc * 0.1913422 - fStack_33c * 0.4619398;
    fVar42 = fVar40 + fVar17;
    fVar15 = fVar11 + fVar13;
    fVar26 = fVar22 + fVar24;
    fVar37 = fVar33 + fVar35;
    fVar6 = fVar39 + fVar5;
    fVar16 = fVar12 + fVar14;
    fVar27 = fVar23 + fVar25;
    fVar38 = fVar34 + fVar36;
    fVar39 = fVar39 - fVar5;
    fVar12 = fVar12 - fVar14;
    fVar23 = fVar23 - fVar25;
    fVar34 = fVar34 - fVar36;
    fVar40 = fVar40 - fVar17;
    fVar11 = fVar11 - fVar13;
    fVar22 = fVar22 - fVar24;
    fVar33 = fVar33 - fVar35;
    pfVar2 = in_RDI + (long)local_bdc * 4;
    *pfVar2 = fVar42 + fVar3;
    pfVar2[1] = fVar15 + fVar41;
    pfVar2[2] = fVar26 + fVar18;
    pfVar2[3] = fVar37 + fVar29;
    pfVar2 = in_RDI + (long)(local_bdc + 2) * 4;
    *pfVar2 = fVar6 + fVar28;
    pfVar2[1] = fVar16 + fVar8;
    pfVar2[2] = fVar27 + fVar19;
    pfVar2[3] = fVar38 + fVar30;
    pfVar2 = in_RDI + (long)(local_bdc + 4) * 4;
    *pfVar2 = fVar39 + fVar7;
    pfVar2[1] = fVar12 + fVar9;
    pfVar2[2] = fVar23 + fVar20;
    pfVar2[3] = fVar34 + fVar31;
    pfVar2 = in_RDI + (long)(local_bdc + 6) * 4;
    *pfVar2 = fVar40 + fVar4;
    pfVar2[1] = fVar11 + fVar10;
    pfVar2[2] = fVar22 + fVar21;
    pfVar2[3] = fVar33 + fVar32;
    pfVar2 = in_RDI + (long)(local_bdc + 8) * 4;
    *pfVar2 = fVar40 - fVar4;
    pfVar2[1] = fVar11 - fVar10;
    pfVar2[2] = fVar22 - fVar21;
    pfVar2[3] = fVar33 - fVar32;
    pfVar2 = in_RDI + (long)(local_bdc + 10) * 4;
    *pfVar2 = fVar39 - fVar7;
    pfVar2[1] = fVar12 - fVar9;
    pfVar2[2] = fVar23 - fVar20;
    pfVar2[3] = fVar34 - fVar31;
    pfVar2 = in_RDI + (long)(local_bdc + 0xc) * 4;
    *pfVar2 = fVar6 - fVar28;
    pfVar2[1] = fVar16 - fVar8;
    pfVar2[2] = fVar27 - fVar19;
    pfVar2[3] = fVar38 - fVar30;
    pfVar2 = in_RDI + (long)(local_bdc + 0xe) * 4;
    *pfVar2 = fVar42 - fVar3;
    pfVar2[1] = fVar15 - fVar41;
    pfVar2[2] = fVar26 - fVar18;
    pfVar2[3] = fVar37 - fVar29;
  }
  return;
}

Assistant:

void
dctInverse8x8_sse2 (float *data)
{
    #ifdef IMF_HAVE_SSE2
        __m128 a  = {3.535536e-01f,3.535536e-01f,3.535536e-01f,3.535536e-01f};
        __m128 b  = {4.903927e-01f,4.903927e-01f,4.903927e-01f,4.903927e-01f};
        __m128 c  = {4.619398e-01f,4.619398e-01f,4.619398e-01f,4.619398e-01f};
        __m128 d  = {4.157349e-01f,4.157349e-01f,4.157349e-01f,4.157349e-01f};
        __m128 e  = {2.777855e-01f,2.777855e-01f,2.777855e-01f,2.777855e-01f};
        __m128 f  = {1.913422e-01f,1.913422e-01f,1.913422e-01f,1.913422e-01f};
        __m128 g  = {9.754573e-02f,9.754573e-02f,9.754573e-02f,9.754573e-02f};

        __m128 c0 = {3.535536e-01f, 3.535536e-01f, 3.535536e-01f, 3.535536e-01f};
        __m128 c1 = {4.619398e-01f, 1.913422e-01f,-1.913422e-01f,-4.619398e-01f};
        __m128 c2 = {3.535536e-01f,-3.535536e-01f,-3.535536e-01f, 3.535536e-01f};
        __m128 c3 = {1.913422e-01f,-4.619398e-01f, 4.619398e-01f,-1.913422e-01f};

        __m128 c4 = {4.903927e-01f, 4.157349e-01f, 2.777855e-01f, 9.754573e-02f};
        __m128 c5 = {4.157349e-01f,-9.754573e-02f,-4.903927e-01f,-2.777855e-01f};
        __m128 c6 = {2.777855e-01f,-4.903927e-01f, 9.754573e-02f, 4.157349e-01f};
        __m128 c7 = {9.754573e-02f,-2.777855e-01f, 4.157349e-01f,-4.903927e-01f};

        __m128 *srcVec = (__m128 *)data;
        __m128 x[8], evenSum, oddSum;
        __m128 in[8], alpha[4], beta[4], theta[4], gamma[4];
        
        //
        // Rows -   
        //
        //  Treat this just like matrix-vector multiplication. The
        //  trick is to note that:
        //
        //    [M00 M01 M02 M03][v0]   [(v0 M00) + (v1 M01) + (v2 M02) + (v3 M03)]
        //    [M10 M11 M12 M13][v1] = [(v0 M10) + (v1 M11) + (v2 M12) + (v3 M13)]
        //    [M20 M21 M22 M23][v2]   [(v0 M20) + (v1 M21) + (v2 M22) + (v3 M23)]
        //    [M30 M31 M32 M33][v3]   [(v0 M30) + (v1 M31) + (v2 M32) + (v3 M33)]
        //
        // Then, we can fill a register with v_i and multiply by the i-th column
        // of M, accumulating across all i-s. 
        //
        // The kids refer to the populating of a register with a single value
        // "broadcasting", and it can be done with a shuffle instruction. It
        // seems to be the slowest part of the whole ordeal.
        //
        // Our matrix columns are stored above in c0-c7. c0-3 make up M1, and
        // c4-7 are from M2.
        //

        #define DCT_INVERSE_8x8_SS2_ROW_LOOP(i)                             \
            /*                                                              \
             * Broadcast the components of the row                          \
             */                                                             \
                                                                            \
            x[0] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (0, 0, 0, 0));               \
                                                                            \
            x[1] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (1, 1, 1, 1));               \
                                                                            \
            x[2] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (2, 2, 2, 2));               \
                                                                            \
            x[3] = _mm_shuffle_ps (srcVec[2 * i],                           \
                                   srcVec[2 * i],                           \
                                   _MM_SHUFFLE (3, 3, 3, 3));               \
                                                                            \
            x[4] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (0, 0, 0, 0));               \
                                                                            \
            x[5] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (1, 1, 1, 1));               \
                                                                            \
            x[6] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (2, 2, 2, 2));               \
                                                                            \
            x[7] = _mm_shuffle_ps (srcVec[2 * i + 1],                       \
                                   srcVec[2 * i + 1],                       \
                                   _MM_SHUFFLE (3, 3, 3, 3));               \
            /*                                                              \
             * Multiply the components by each column of the matrix         \
             */                                                             \
                                                                            \
            x[0] = _mm_mul_ps (x[0], c0);                                   \
            x[2] = _mm_mul_ps (x[2], c1);                                   \
            x[4] = _mm_mul_ps (x[4], c2);                                   \
            x[6] = _mm_mul_ps (x[6], c3);                                   \
                                                                            \
            x[1] = _mm_mul_ps (x[1], c4);                                   \
            x[3] = _mm_mul_ps (x[3], c5);                                   \
            x[5] = _mm_mul_ps (x[5], c6);                                   \
            x[7] = _mm_mul_ps (x[7], c7);                                   \
                                                                            \
            /*                                                              \
             * Add across                                                   \
             */                                                             \
                                                                            \
            evenSum = _mm_setzero_ps();                                     \
            evenSum = _mm_add_ps (evenSum, x[0]);                           \
            evenSum = _mm_add_ps (evenSum, x[2]);                           \
            evenSum = _mm_add_ps (evenSum, x[4]);                           \
            evenSum = _mm_add_ps (evenSum, x[6]);                           \
                                                                            \
            oddSum = _mm_setzero_ps();                                      \
            oddSum = _mm_add_ps (oddSum, x[1]);                             \
            oddSum = _mm_add_ps (oddSum, x[3]);                             \
            oddSum = _mm_add_ps (oddSum, x[5]);                             \
            oddSum = _mm_add_ps (oddSum, x[7]);                             \
                                                                            \
            /*                                                              \
             * Final Sum:                                                   \
             *    out [0, 1, 2, 3] = evenSum + oddSum                       \
             *    out [7, 6, 5, 4] = evenSum - oddSum                       \
             */                                                             \
                                                                            \
            srcVec[2 * i]     = _mm_add_ps (evenSum, oddSum);               \
            srcVec[2 * i + 1] = _mm_sub_ps (evenSum, oddSum);               \
            srcVec[2 * i + 1] = _mm_shuffle_ps (srcVec[2 * i + 1],          \
                                                srcVec[2 * i + 1],          \
                                                _MM_SHUFFLE (0, 1, 2, 3));

        switch (zeroedRows)
        {
          case 0:
          default:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (7)
            break;

          case 1:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (6)
            break;

          case 2:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (5)
            break;

          case 3:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (4)
            break;

          case 4:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (3)
            break;

          case 5:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (2)
            break;

          case 6:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            DCT_INVERSE_8x8_SS2_ROW_LOOP (1)
            break;

          case 7:
            DCT_INVERSE_8x8_SS2_ROW_LOOP (0)
            break;
        }

        //
        // Columns -
        //
        // This is slightly more straightforward, if less readable. Here
        // we just operate on 4 columns at a time, in two batches.
        //
        // The slight mess is to try and cache sub-expressions, which
        // we ignore in the row-wise pass.
        //

        for (int col = 0; col < 2; ++col)
        {

            for (int i = 0; i < 8; ++i)
                in[i] = srcVec[2 * i + col];

            alpha[0] = _mm_mul_ps (c, in[2]);
            alpha[1] = _mm_mul_ps (f, in[2]);
            alpha[2] = _mm_mul_ps (c, in[6]);
            alpha[3] = _mm_mul_ps (f, in[6]);

            beta[0] = _mm_add_ps (_mm_add_ps (_mm_mul_ps (in[1], b),
                                                          _mm_mul_ps (in[3], d)),
                                              _mm_add_ps (_mm_mul_ps (in[5], e),
                                                          _mm_mul_ps (in[7], g)));

            beta[1] = _mm_sub_ps (_mm_sub_ps (_mm_mul_ps (in[1], d),
                                                          _mm_mul_ps (in[3], g)),
                                              _mm_add_ps (_mm_mul_ps (in[5], b),
                                                          _mm_mul_ps (in[7], e)));

            beta[2] = _mm_add_ps (_mm_sub_ps (_mm_mul_ps (in[1], e),
                                                          _mm_mul_ps (in[3], b)),
                                              _mm_add_ps (_mm_mul_ps (in[5], g),
                                                          _mm_mul_ps (in[7], d)));

            beta[3] = _mm_add_ps (_mm_sub_ps (_mm_mul_ps (in[1], g),
                                                          _mm_mul_ps (in[3], e)),
                                              _mm_sub_ps (_mm_mul_ps (in[5], d),
                                                          _mm_mul_ps (in[7], b)));

            theta[0] = _mm_mul_ps (a, _mm_add_ps (in[0], in[4]));
            theta[3] = _mm_mul_ps (a, _mm_sub_ps (in[0], in[4]));

            theta[1] = _mm_add_ps (alpha[0], alpha[3]);
            theta[2] = _mm_sub_ps (alpha[1], alpha[2]);

            gamma[0] = _mm_add_ps (theta[0], theta[1]);
            gamma[1] = _mm_add_ps (theta[3], theta[2]);
            gamma[2] = _mm_sub_ps (theta[3], theta[2]);
            gamma[3] = _mm_sub_ps (theta[0], theta[1]);

            srcVec[  col] = _mm_add_ps (gamma[0], beta[0]);
            srcVec[2+col] = _mm_add_ps (gamma[1], beta[1]);
            srcVec[4+col] = _mm_add_ps (gamma[2], beta[2]);
            srcVec[6+col] = _mm_add_ps (gamma[3], beta[3]);

            srcVec[ 8+col] = _mm_sub_ps (gamma[3], beta[3]);
            srcVec[10+col] = _mm_sub_ps (gamma[2], beta[2]);
            srcVec[12+col] = _mm_sub_ps (gamma[1], beta[1]);
            srcVec[14+col] = _mm_sub_ps (gamma[0], beta[0]);
        }

    #else /* IMF_HAVE_SSE2 */

        dctInverse8x8_scalar<zeroedRows> (data);

    #endif /* IMF_HAVE_SSE2 */
}